

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

char * Get_First_Whitespace_Character(char *buf,int blen)

{
  bool bVar1;
  char *local_38;
  char *end;
  char *p;
  int blen_local;
  char *buf_local;
  
  if ((buf != (char *)0x0) && (end = buf, -1 < blen)) {
    while( true ) {
      bVar1 = false;
      if (end < buf + blen) {
        bVar1 = *end != ' ';
      }
      if (!bVar1) break;
      end = end + 1;
    }
    local_38 = buf;
    if (end != buf + blen) {
      local_38 = end;
    }
    return local_38;
  }
  __assert_fail("buf && blen>=0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CursesDialog/form/frm_driver.c"
                ,0x10f,"char *Get_First_Whitespace_Character(char *, int)");
}

Assistant:

INLINE static char *Get_First_Whitespace_Character(char * buf, int blen)
{
  char *p   = buf;
  char *end = &p[blen];
  
  assert(buf && blen>=0);
  while( (p < end) && !is_blank(*p)) 
    p++;
  return( (p==end) ? buf : p );
}